

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  int *piVar1;
  int *piVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  if ((cf->field_0x24 & 1) == 0) {
    piVar1 = (int *)cf->ctx;
    piVar2 = piVar1;
    for (uVar4 = 0; uVar4 < *(ulong *)(piVar1 + 0x26); uVar4 = uVar4 + 1) {
      if ((((*(Curl_cfilter **)(piVar2 + 0xc) != (Curl_cfilter *)0x0) && (piVar2[0xe] == 0)) &&
          (CVar3 = Curl_conn_cf_cntrl(*(Curl_cfilter **)(piVar2 + 0xc),data,false,event,arg1,arg2),
          CVar3 != CURLE_AGAIN)) && (CVar3 != CURLE_OK)) {
        return CVar3;
      }
      piVar2 = piVar2 + 0xe;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_hc_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  size_t i;

  if(!cf->connected) {
    for(i = 0; i < ctx->baller_count; i++) {
      result = cf_hc_baller_cntrl(&ctx->ballers[i], data, event, arg1, arg2);
      if(result && (result != CURLE_AGAIN))
        goto out;
    }
    result = CURLE_OK;
  }
out:
  return result;
}